

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall
LinearScan::AvoidCompensationConflicts
          (LinearScan *this,LabelInstr *labelInstr,BranchInstr *branchInstr,
          Lifetime **labelRegContent,Lifetime **branchRegContent,Instr **pInsertionInstr,
          Instr **pInsertionStartInstr,bool needsAirlock,bool *pHasAirlock)

{
  IRType type;
  RegNum reg;
  Lifetime *pLVar1;
  long lVar2;
  bool bVar3;
  BitVector BVar4;
  bool bVar5;
  Instr *pIVar6;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd;
  uint index;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  RegNum aRStack_a8 [8];
  RegNum conflictRegs [33];
  BVUnitT<unsigned_long> local_68;
  BitVector _unit;
  
  _unit.word = (Type)pInsertionInstr;
  do {
    conflictRegs[8] = RegNOREG;
    conflictRegs[9] = RegNOREG;
    conflictRegs[10] = RegNOREG;
    conflictRegs[0xb] = RegNOREG;
    conflictRegs[0xc] = RegNOREG;
    conflictRegs[0xd] = RegNOREG;
    conflictRegs[0xe] = RegNOREG;
    conflictRegs[0xf] = RegNOREG;
    conflictRegs[0x10] = RegNOREG;
    conflictRegs[0x11] = RegNOREG;
    conflictRegs[0x12] = RegNOREG;
    conflictRegs[0x13] = RegNOREG;
    conflictRegs[0x14] = RegNOREG;
    conflictRegs[0x15] = RegNOREG;
    conflictRegs[0x16] = RegNOREG;
    conflictRegs[0x17] = RegNOREG;
    aRStack_a8[0] = RegNOREG;
    aRStack_a8[1] = RegNOREG;
    aRStack_a8[2] = RegNOREG;
    aRStack_a8[3] = RegNOREG;
    aRStack_a8[4] = RegNOREG;
    aRStack_a8[5] = RegNOREG;
    aRStack_a8[6] = RegNOREG;
    aRStack_a8[7] = RegNOREG;
    conflictRegs[0] = RegNOREG;
    conflictRegs[1] = RegNOREG;
    conflictRegs[2] = RegNOREG;
    conflictRegs[3] = RegNOREG;
    conflictRegs[4] = RegNOREG;
    conflictRegs[5] = RegNOREG;
    conflictRegs[6] = RegNOREG;
    conflictRegs[7] = RegNOREG;
    conflictRegs[0x18] = RegNOREG;
    local_68.word = (this->secondChanceRegs).word;
    bVar3 = false;
LAB_00538030:
    if (local_68.word != 0) {
      lVar2 = 0;
      if (local_68.word != 0) {
        for (; (local_68.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      index = -(uint)(local_68.word == 0) | (uint)lVar2;
      BVUnitT<unsigned_long>::Clear(&local_68,index);
      BVar4 = _unit;
      uVar9 = (ulong)index;
      pLVar1 = branchRegContent[uVar9];
      if (pLVar1 != labelRegContent[uVar9]) {
        type = RegTypes[uVar9];
        bVar5 = IRType_IsFloat(type);
        if ((!bVar5) && (bVar5 = NeedsLoopBackEdgeCompensation(this,pLVar1,labelInstr), bVar5)) {
          pIVar6 = EnsureAirlock(this,needsAirlock,pHasAirlock,*(Instr **)BVar4.word,
                                 pInsertionStartInstr,branchInstr,labelInstr);
          *(Instr **)BVar4.word = pIVar6;
          reg = conflictRegs[uVar9 - 8];
          uVar8 = (ulong)reg;
          if (uVar8 != 0) {
            dstOpnd = IR::RegOpnd::New(branchRegContent[uVar9]->sym,(RegNum)index,type,this->func);
            index = (uint)reg;
            src2Opnd = IR::RegOpnd::New(branchRegContent[uVar9]->sym,reg,type,this->func);
            pIVar6 = IR::Instr::New(XCHG,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,
                                    &src2Opnd->super_Opnd,this->func);
            BVar4 = _unit;
            IR::Instr::InsertBefore(*(Instr **)_unit.word,pIVar6);
            IR::Instr::CopyNumber(pIVar6,*(Instr **)BVar4.word);
            pLVar1 = branchRegContent[uVar9];
            branchRegContent[uVar9] = branchRegContent[uVar8];
            branchRegContent[uVar8] = pLVar1;
            bVar3 = true;
            uVar9 = uVar8;
          }
          lVar2 = 0;
          do {
            lVar7 = lVar2;
            if ((char)lVar7 == '\x10') goto LAB_00538030;
            lVar2 = lVar7 + 1;
          } while (labelRegContent[lVar7 + 1] != branchRegContent[uVar9]);
          conflictRegs[lVar7 + -7] = (RegNum)index;
        }
      }
      goto LAB_00538030;
    }
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void LinearScan::AvoidCompensationConflicts(IR::LabelInstr *labelInstr, IR::BranchInstr *branchInstr,
                                            Lifetime *labelRegContent[], Lifetime *branchRegContent[],
                                            IR::Instr **pInsertionInstr, IR::Instr **pInsertionStartInstr, bool needsAirlock, bool *pHasAirlock)
{
    bool changed = true;

    // Look for conflicts in the incoming compensation code:
    //      MOV     ESI, EAX
    //      MOV     ECX, ESI    <<  ESI was lost...
    // Using XCHG:
    //      XCHG    ESI, EAX
    //      MOV     ECX, EAX
    //
    // Note that we need to iterate while(changed) to catch all conflicts
    while(changed) {
        RegNum conflictRegs[RegNumCount] = {RegNOREG};
        changed = false;

        FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
        {
            Lifetime *labelLifetime = labelRegContent[reg];
            Lifetime *lifetime = branchRegContent[reg];

            // We don't have an XCHG for SSE2 regs
            if (lifetime == labelLifetime || IRType_IsFloat(RegTypes[reg]))
            {
                continue;
            }

            if (this->NeedsLoopBackEdgeCompensation(lifetime, labelInstr))
            {
                // Mismatch, we need to insert compensation code
                *pInsertionInstr = this->EnsureAirlock(needsAirlock, pHasAirlock, *pInsertionInstr, pInsertionStartInstr, branchInstr, labelInstr);

                if (conflictRegs[reg] != RegNOREG)
                {
                    // Eliminate conflict with an XCHG
                    IR::RegOpnd *reg1 = IR::RegOpnd::New(branchRegContent[reg]->sym, (RegNum)reg, RegTypes[reg], this->func);
                    IR::RegOpnd *reg2 = IR::RegOpnd::New(branchRegContent[reg]->sym, conflictRegs[reg], RegTypes[reg], this->func);
                    IR::Instr *instrXchg = IR::Instr::New(Js::OpCode::XCHG, reg1, reg1, reg2, this->func);
                    (*pInsertionInstr)->InsertBefore(instrXchg);
                    instrXchg->CopyNumber(*pInsertionInstr);

                    Lifetime *tmpLifetime = branchRegContent[reg];
                    branchRegContent[reg] = branchRegContent[conflictRegs[reg]];
                    branchRegContent[conflictRegs[reg]] = tmpLifetime;
                    reg = conflictRegs[reg];

                    changed = true;
                }
                RegNum labelReg = RegNOREG;
                FOREACH_INT_REG(regIter)
                {
                    if (labelRegContent[regIter] == branchRegContent[reg])
                    {
                        labelReg = regIter;
                        break;
                    }
                } NEXT_INT_REG;

                if (labelReg != RegNOREG)
                {
                    conflictRegs[labelReg] = (RegNum)reg;
                }
            }
        } NEXT_BITSET_IN_UNITBV;
    }
}